

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gim_contact.cpp
# Opt level: O3

void __thiscall
gim_contact_array::merge_contacts_unique(gim_contact_array *this,gim_contact_array *contacts)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  void *pvVar8;
  ulong uVar9;
  long lVar10;
  
  if (*(int *)(this + 8) != 0) {
    *(undefined4 *)(this + 8) = 0;
  }
  if (*(int *)(contacts + 8) == 1) {
    puVar2 = *(undefined8 **)contacts;
    if (*(int *)(this + 0xc) == 0) {
      *(undefined4 *)(this + 8) = 0;
      pvVar8 = gim_alloc(0xc0);
      *(void **)this = pvVar8;
      *(undefined4 *)(this + 0xc) = 4;
      uVar9 = (ulong)*(uint *)(this + 8);
    }
    else {
      pvVar8 = *(void **)this;
      uVar9 = 0;
    }
    lVar10 = uVar9 * 0x30;
    uVar3 = *puVar2;
    uVar4 = puVar2[1];
    uVar5 = puVar2[2];
    uVar6 = puVar2[3];
    uVar7 = puVar2[5];
    puVar1 = (undefined8 *)((long)pvVar8 + lVar10 + 0x20);
    *puVar1 = puVar2[4];
    puVar1[1] = uVar7;
    puVar2 = (undefined8 *)((long)pvVar8 + lVar10 + 0x10);
    *puVar2 = uVar5;
    puVar2[1] = uVar6;
    *(undefined8 *)((long)pvVar8 + lVar10) = uVar3;
    ((undefined8 *)((long)pvVar8 + lVar10))[1] = uVar4;
    *(int *)(this + 8) = *(int *)(this + 8) + 1;
  }
  return;
}

Assistant:

void gim_contact_array::merge_contacts_unique(const gim_contact_array & contacts)
{
	clear();

	if(contacts.size()==1)
	{
		push_back(contacts.back());
		return;
	}

	GIM_CONTACT average_contact = contacts.back();

	for (GUINT i=1;i<contacts.size() ;i++ )
	{
		average_contact.m_point += contacts[i].m_point;
		average_contact.m_normal += contacts[i].m_normal * contacts[i].m_depth;
	}

	//divide
	GREAL divide_average = 1.0f/((GREAL)contacts.size());

	average_contact.m_point *= divide_average;

	average_contact.m_normal *= divide_average;

	average_contact.m_depth = average_contact.m_normal.length();

	average_contact.m_normal /= average_contact.m_depth;

}